

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timedependent.cxx
# Opt level: O0

void __thiscall Time::add(Time *this,TimeDependent *object)

{
  bool bVar1;
  size_type sVar2;
  reference ppTVar3;
  bool bVar4;
  uint local_20;
  uint i;
  bool found;
  TimeDependent *object_local;
  Time *this_local;
  
  bVar1 = false;
  local_20 = 0;
  _i = object;
  object_local = (TimeDependent *)this;
  while( true ) {
    bVar4 = false;
    if (!bVar1) {
      sVar2 = std::vector<TimeDependent_*,_std::allocator<TimeDependent_*>_>::size
                        (&this->timeObjects);
      bVar4 = local_20 < sVar2;
    }
    if (!bVar4) break;
    ppTVar3 = std::vector<TimeDependent_*,_std::allocator<TimeDependent_*>_>::operator[]
                        (&this->timeObjects,(ulong)local_20);
    if (*ppTVar3 == _i) {
      bVar1 = true;
    }
    local_20 = local_20 + 1;
  }
  if (!bVar1) {
    std::vector<TimeDependent_*,_std::allocator<TimeDependent_*>_>::push_back
              (&this->timeObjects,(value_type *)&i);
  }
  return;
}

Assistant:

void Time::add( class TimeDependent *object )
{
	// find object in already registered objects
	bool found = false;
	for (uint i=0; !found && i<timeObjects.size(); ++i)
		if (timeObjects[i] == object)
			found = true;

	// add if not found
	if (!found)
		timeObjects.push_back( object );
}